

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O2

void * MissionLogThread(void *pParam)

{
  double dVar1;
  FILE *__stream;
  uint extraout_XMM0_Dd;
  double longhat;
  double lathat;
  double local_78;
  uint uStack_6c;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double althat;
  
  lathat = 0.0;
  longhat = 0.0;
  althat = 0.0;
  do {
    mSleep(100);
    pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
    if ((bMissionRunning != 0) && (logmissionfile != (FILE *)0x0)) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_78 = lat_env;
      local_40 = long_env;
      local_48 = alt_env;
      local_50 = angle_env;
      local_58 = Center((interval *)&xhat);
      local_60 = Center((interval *)&yhat);
      dVar1 = Center((interval *)&zhat);
      EnvCoordSystem2GPS(local_78,local_40,local_48,local_50,local_58,local_60,dVar1,&lathat,
                         &longhat,&althat);
      local_78 = Center((interval *)&zhat);
      uStack_6c = extraout_XMM0_Dd ^ 0x80000000;
      local_78 = -local_78;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      __stream = logmissionfile;
      dVar1 = GetTimeElapsedChronoQuick(&chrono_mission);
      fprintf((FILE *)__stream,"%f;%f;%f;%f;%s;\n",SUB84(dVar1,0),lathat,longhat,local_78,szAction);
      fflush((FILE *)logmissionfile);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MissionLogThread(void* pParam)
{
	double lathat = 0, longhat = 0, althat = 0, depthhat = 0;

	UNREFERENCED_PARAMETER(pParam);

	for (;;)
	{
		mSleep(100);

		EnterCriticalSection(&MissionFilesCS);
		if (bMissionRunning&&(logmissionfile != NULL))
		{
			EnterCriticalSection(&StateVariablesCS);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
			depthhat = -Center(zhat);
			LeaveCriticalSection(&StateVariablesCS);

			// szAction is not protected and might be temporarily invalid when it is changing, 
			// but this should not cause a crash...

			fprintf(logmissionfile, "%f;%f;%f;%f;%s;\n",
				GetTimeElapsedChronoQuick(&chrono_mission), lathat, longhat, depthhat, szAction
			);
			fflush(logmissionfile);
		}
		LeaveCriticalSection(&MissionFilesCS);

		if (bExit) break;
	}

	return 0;
}